

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Select * sqlite3MultiValues(Parse *pParse,Select *pLeft,ExprList *pRow)

{
  SrcList *pSVar1;
  int iVar2;
  Select *pSVar3;
  int *in_RDX;
  Select *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Subquery *pSubq_1;
  Subquery *pSubq;
  Select *pRet;
  Vdbe *v;
  SrcItem *p;
  int f;
  Select *pSelect;
  SelectDest dest;
  SelectDest *in_stack_000001f0;
  Select *in_stack_000001f8;
  Parse *in_stack_00000200;
  Parse *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Parse *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Parse *in_stack_ffffffffffffff78;
  Expr *in_stack_ffffffffffffff80;
  SrcList *in_stack_ffffffffffffff88;
  Select *in_stack_ffffffffffffff90;
  Parse *in_stack_ffffffffffffff98;
  Parse *pParse_00;
  Select *local_40;
  SelectDest local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((*(char *)((long)in_RDI + 0x27) == '\0') && (*(char *)(*in_RDI + 0xc5) == '\0')) &&
      (iVar2 = exprListIsConstant(in_stack_ffffffffffffff68,
                                  (ExprList *)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
      iVar2 != 0)) &&
     (((in_RSI->pSrc->nSrc != 0 ||
       (iVar2 = exprListIsNoAffinity
                          (in_stack_ffffffffffffff68,
                           (ExprList *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                          ), iVar2 != 0)) && (*(char *)((long)in_RDI + 0x134) == '\0')))) {
    pParse_00 = (Parse *)0x0;
    local_40 = in_RSI;
    if (in_RSI->pSrc->nSrc == 0) {
      in_stack_ffffffffffffff98 = (Parse *)sqlite3GetVdbe(in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff58 = (Parse *)0x0;
      in_stack_ffffffffffffff60 = 0;
      pSVar3 = (Select *)0x0;
      in_stack_ffffffffffffff90 =
           sqlite3SelectNew(in_stack_ffffffffffffff98,(ExprList *)in_stack_ffffffffffffff90,
                            in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            (ExprList *)in_stack_ffffffffffffff78,
                            (Expr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            (ExprList *)pSubq,(u32)pRet,(Expr *)v);
      if ((*(uint *)(*in_RDI + 0x2c) & 0x10) == 0) {
        sqlite3ReadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      if (in_stack_ffffffffffffff90 != (Select *)0x0) {
        memset(&local_30,0xaa,0x28);
        in_stack_ffffffffffffff88 = (SrcList *)&DAT_aaaaaaaaaaaaaaaa;
        in_stack_ffffffffffffff90->pSrc->nSrc = 1;
        in_stack_ffffffffffffff90->pPrior = in_RSI->pPrior;
        in_stack_ffffffffffffff90->op = in_RSI->op;
        if (in_stack_ffffffffffffff90->pPrior != (Select *)0x0) {
          in_stack_ffffffffffffff90->selFlags = in_stack_ffffffffffffff90->selFlags | 0x200;
        }
        in_RSI->pPrior = (Select *)0x0;
        in_RSI->op = 0x8b;
        pSVar1 = in_stack_ffffffffffffff90->pSrc;
        pParse_00 = (Parse *)pSVar1->a;
        *(ushort *)&pSVar1->a[0].fg.field_0x1 =
             *(ushort *)&pSVar1->a[0].fg.field_0x1 & 0xffbf | 0x40;
        pSVar1->a[0].iCursor = -1;
        pSVar1->a[0].u1.nRow = 2;
        iVar2 = sqlite3SrcItemAttachSubquery
                          (in_stack_ffffffffffffff78,
                           (SrcItem *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           pSVar3,in_stack_ffffffffffffff64);
        local_40 = in_stack_ffffffffffffff90;
        if (iVar2 != 0) {
          in_stack_ffffffffffffff88 =
               (SrcList *)((anon_union_8_3_5f9225e5_for_u4 *)&pParse_00->szOpAlloc)->pSubq;
          iVar2 = sqlite3VdbeCurrentAddr((Vdbe *)in_stack_ffffffffffffff98);
          *(int *)&in_stack_ffffffffffffff88->a[0].zName = iVar2 + 1;
          iVar2 = *(int *)((long)in_RDI + 0x3c) + 1;
          *(int *)((long)in_RDI + 0x3c) = iVar2;
          *(int *)((long)&in_stack_ffffffffffffff88->a[0].zName + 4) = iVar2;
          sqlite3VdbeAddOp3((Vdbe *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                            in_stack_ffffffffffffff70,(int)((ulong)pSVar3 >> 0x20),(int)pSVar3);
          sqlite3SelectDestInit
                    (&local_30,0xd,*(int *)((long)&in_stack_ffffffffffffff88->a[0].zName + 4));
          local_30.iSdst = *(int *)((long)in_RDI + 0x3c) + 3;
          local_30.nSdst = in_RSI->pEList->nExpr;
          *(int *)((long)in_RDI + 0x3c) = local_30.nSdst + 2 + *(int *)((long)in_RDI + 0x3c);
          in_RSI->selFlags = in_RSI->selFlags | 0x400;
          sqlite3Select(in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
          *(int *)&in_stack_ffffffffffffff88->a[0].zAlias = local_30.iSdst;
          local_40 = in_stack_ffffffffffffff90;
        }
      }
    }
    else {
      pSVar1 = in_RSI->pSrc;
      pParse_00 = (Parse *)pSVar1->a;
      pSVar1->a[0].u1.nRow = pSVar1->a[0].u1.nRow + 1;
    }
    if (*(int *)((long)in_RDI + 0x34) == 0) {
      if (**(int **)(**(long **)&pParse_00->szOpAlloc + 0x20) == *in_RDX) {
        sqlite3ExprCodeExprList
                  (pParse_00,(ExprList *)in_stack_ffffffffffffff98,
                   (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                   (u8)((ulong)in_stack_ffffffffffffff88 >> 0x38));
        sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                          (int)in_stack_ffffffffffffff58);
      }
      else {
        sqlite3SelectWrongNumTermsError
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   (Select *)in_stack_ffffffffffffff58);
      }
    }
    sqlite3ExprListDelete
              ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ExprList *)in_stack_ffffffffffffff58);
  }
  else {
    if (in_RSI->pSrc->nSrc != 0) {
      sqlite3MultiValuesEnd
                ((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 (Select *)in_stack_ffffffffffffff58);
    }
    pSVar3 = sqlite3SelectNew(in_stack_ffffffffffffff98,(ExprList *)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                              (ExprList *)in_stack_ffffffffffffff78,
                              (Expr *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              (ExprList *)pSubq,(u32)pRet,(Expr *)v);
    in_RSI->selFlags = in_RSI->selFlags & 0xfffffbff;
    local_40 = in_RSI;
    if (pSVar3 != (Select *)0x0) {
      pSVar3->op = 0x88;
      pSVar3->pPrior = in_RSI;
      local_40 = pSVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Select *sqlite3MultiValues(Parse *pParse, Select *pLeft, ExprList *pRow){

  if( pParse->bHasWith                   /* condition (a) above */
   || pParse->db->init.busy              /* condition (b) above */
   || exprListIsConstant(pParse,pRow)==0 /* condition (c) above */
   || (pLeft->pSrc->nSrc==0 &&
       exprListIsNoAffinity(pParse,pLeft->pEList)==0) /* condition (d) above */
   || IN_SPECIAL_PARSE
  ){
    /* The co-routine method cannot be used. Fall back to UNION ALL. */
    Select *pSelect = 0;
    int f = SF_Values | SF_MultiValue;
    if( pLeft->pSrc->nSrc ){
      sqlite3MultiValuesEnd(pParse, pLeft);
      f = SF_Values;
    }else if( pLeft->pPrior ){
      /* In this case set the SF_MultiValue flag only if it was set on pLeft */
      f = (f & pLeft->selFlags);
    }
    pSelect = sqlite3SelectNew(pParse, pRow, 0, 0, 0, 0, 0, f, 0);
    pLeft->selFlags &= ~SF_MultiValue;
    if( pSelect ){
      pSelect->op = TK_ALL;
      pSelect->pPrior = pLeft;
      pLeft = pSelect;
    }
  }else{
    SrcItem *p = 0;               /* SrcItem that reads from co-routine */

    if( pLeft->pSrc->nSrc==0 ){
      /* Co-routine has not yet been started and the special Select object
      ** that accesses the co-routine has not yet been created. This block
      ** does both those things. */
      Vdbe *v = sqlite3GetVdbe(pParse);
      Select *pRet = sqlite3SelectNew(pParse, 0, 0, 0, 0, 0, 0, 0, 0);

      /* Ensure the database schema has been read. This is to ensure we have
      ** the correct text encoding.  */
      if( (pParse->db->mDbFlags & DBFLAG_SchemaKnownOk)==0 ){
        sqlite3ReadSchema(pParse);
      }

      if( pRet ){
        SelectDest dest;
        Subquery *pSubq;
        pRet->pSrc->nSrc = 1;
        pRet->pPrior = pLeft->pPrior;
        pRet->op = pLeft->op;
        if( pRet->pPrior ) pRet->selFlags |= SF_Values;
        pLeft->pPrior = 0;
        pLeft->op = TK_SELECT;
        assert( pLeft->pNext==0 );
        assert( pRet->pNext==0 );
        p = &pRet->pSrc->a[0];
        p->fg.viaCoroutine = 1;
        p->iCursor = -1;
        assert( !p->fg.isIndexedBy && !p->fg.isTabFunc );
        p->u1.nRow = 2;
        if( sqlite3SrcItemAttachSubquery(pParse, p, pLeft, 0) ){
          pSubq = p->u4.pSubq;
          pSubq->addrFillSub = sqlite3VdbeCurrentAddr(v) + 1;
          pSubq->regReturn = ++pParse->nMem;
          sqlite3VdbeAddOp3(v, OP_InitCoroutine,
                            pSubq->regReturn, 0, pSubq->addrFillSub);
          sqlite3SelectDestInit(&dest, SRT_Coroutine, pSubq->regReturn);

          /* Allocate registers for the output of the co-routine. Do so so
          ** that there are two unused registers immediately before those
          ** used by the co-routine. This allows the code in sqlite3Insert()
          ** to use these registers directly, instead of copying the output
          ** of the co-routine to a separate array for processing.  */
          dest.iSdst = pParse->nMem + 3;
          dest.nSdst = pLeft->pEList->nExpr;
          pParse->nMem += 2 + dest.nSdst;

          pLeft->selFlags |= SF_MultiValue;
          sqlite3Select(pParse, pLeft, &dest);
          pSubq->regResult = dest.iSdst;
          assert( pParse->nErr || dest.iSdst>0 );
        }
        pLeft = pRet;
      }
    }else{
      p = &pLeft->pSrc->a[0];
      assert( !p->fg.isTabFunc && !p->fg.isIndexedBy );
      p->u1.nRow++;
    }

    if( pParse->nErr==0 ){
      Subquery *pSubq;
      assert( p!=0 );
      assert( p->fg.isSubquery );
      pSubq = p->u4.pSubq;
      assert( pSubq!=0 );
      assert( pSubq->pSelect!=0 );
      assert( pSubq->pSelect->pEList!=0 );
      if( pSubq->pSelect->pEList->nExpr!=pRow->nExpr ){
        sqlite3SelectWrongNumTermsError(pParse, pSubq->pSelect);
      }else{
        sqlite3ExprCodeExprList(pParse, pRow, pSubq->regResult, 0, 0);
        sqlite3VdbeAddOp1(pParse->pVdbe, OP_Yield, pSubq->regReturn);
      }
    }
    sqlite3ExprListDelete(pParse->db, pRow);
  }

  return pLeft;
}